

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_all_handshakes(void)

{
  ptls_context_t *ppVar1;
  ptls_context_t *ppVar2;
  ptls_sign_certificate_t client_sc;
  ptls_sign_certificate_t server_sc;
  ptls_sign_certificate_t local_10;
  ptls_sign_certificate_t local_8;
  
  ppVar1 = ctx_peer;
  local_8.cb = sign_certificate;
  sc_orig = ctx_peer->sign_certificate;
  ctx_peer->sign_certificate = &local_8;
  ppVar2 = ctx;
  ctx->private_key_method = &private_key_method;
  ppVar1->private_key_method = &private_key_method;
  local_10.cb = second_sign_certificate;
  if (ppVar1 != ppVar2) {
    second_sc_orig = ppVar2->sign_certificate;
    ppVar2->sign_certificate = &local_10;
  }
  subtest("full-handshake",test_full_handshake);
  subtest("full-handshake-with-client-authentication",test_full_handshake_with_client_authentication
         );
  subtest("hrr-handshake",test_hrr_handshake);
  subtest("hrr-stateless-handshake",test_hrr_stateless_handshake);
  subtest("resumption",test_resumption);
  subtest("resumption-different-preferred-key-share",test_resumption_different_preferred_key_share);
  subtest("resumption-with-client-authentication",test_resumption_with_client_authentication);
  subtest("enforce-retry-stateful",test_enforce_retry_stateful);
  subtest("enforce-retry-stateless",test_enforce_retry_stateless);
  subtest("stateless-hrr-aad-change",test_stateless_hrr_aad_change);
  subtest("key-update",test_key_update);
  subtest("handshake-api",test_handshake_api);
  ppVar1 = ctx_peer;
  ctx_peer->sign_certificate = sc_orig;
  if (ppVar1 != ctx) {
    ctx->sign_certificate = second_sc_orig;
  }
  return;
}

Assistant:

static void test_all_handshakes(void)
{
    ptls_sign_certificate_t server_sc = {sign_certificate};
    sc_orig = ctx_peer->sign_certificate;
    ctx_peer->sign_certificate = &server_sc;

    ctx->private_key_method = &private_key_method;
    ctx_peer->private_key_method = &private_key_method;

    ptls_sign_certificate_t client_sc = {second_sign_certificate};
    if (ctx_peer != ctx) {
        second_sc_orig = ctx->sign_certificate;
        ctx->sign_certificate = &client_sc;
    }

    subtest("full-handshake", test_full_handshake);
    subtest("full-handshake-with-client-authentication", test_full_handshake_with_client_authentication);
    subtest("hrr-handshake", test_hrr_handshake);
    subtest("hrr-stateless-handshake", test_hrr_stateless_handshake);
    subtest("resumption", test_resumption);
    subtest("resumption-different-preferred-key-share", test_resumption_different_preferred_key_share);
    subtest("resumption-with-client-authentication", test_resumption_with_client_authentication);

    subtest("enforce-retry-stateful", test_enforce_retry_stateful);
    subtest("enforce-retry-stateless", test_enforce_retry_stateless);

    subtest("stateless-hrr-aad-change", test_stateless_hrr_aad_change);

    subtest("key-update", test_key_update);

    subtest("handshake-api", test_handshake_api);

    ctx_peer->sign_certificate = sc_orig;

    if (ctx_peer != ctx)
        ctx->sign_certificate = second_sc_orig;
}